

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

PrimitiveTestClass * __thiscall
PrimitiveTestClass::operator=(PrimitiveTestClass *this,PrimitiveTestClass *other)

{
  size_t __n;
  size_t __n_00;
  undefined8 uVar1;
  code *pcVar2;
  size_t __n_01;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  uchar *__dest;
  short *__dest_00;
  unsigned_short *__dest_01;
  int *__dest_02;
  uint *__dest_03;
  long *__dest_04;
  unsigned_long *__dest_05;
  longlong *__dest_06;
  unsigned_long_long *__dest_07;
  float *__dest_08;
  double *__dest_09;
  longdouble *__dest_10;
  ulong *puVar8;
  ulong *puVar9;
  ulong __n_02;
  ulong uVar10;
  long lVar11;
  
  this->c = other->c;
  this->uc = other->uc;
  this->s = other->s;
  this->us = other->us;
  this->i = other->i;
  this->ui = other->ui;
  this->l = other->l;
  this->ul = other->ul;
  this->ll = other->ll;
  this->ull = other->ull;
  this->f = other->f;
  this->d = other->d;
  this->ld = other->ld;
  pcVar3 = (char *)operator_new__(0xd);
  this->str = pcVar3;
  uVar1 = *(undefined8 *)(other->str + 5);
  *(undefined8 *)pcVar3 = *(undefined8 *)other->str;
  *(undefined8 *)(pcVar3 + 5) = uVar1;
  __n_02 = (ulong)this->SIZE;
  lVar11 = __n_02 * 0x20;
  uVar10 = 0xffffffffffffffff;
  uVar4 = lVar11 + 8;
  if ((long)__n_02 < 0) {
    uVar4 = uVar10;
  }
  sVar5 = __n_02 << 4;
  if ((long)__n_02 < 0) {
    sVar5 = uVar10;
  }
  __n = __n_02 * 8;
  sVar6 = __n;
  if ((long)__n_02 < 0) {
    sVar6 = uVar10;
  }
  __n_00 = __n_02 * 4;
  sVar7 = __n_00;
  if ((long)__n_02 < 0) {
    sVar7 = uVar10;
  }
  __n_01 = __n_02 * 2;
  if (-1 < (long)__n_02) {
    uVar10 = __n_01;
  }
  pcVar3 = (char *)operator_new__(__n_02);
  this->pc = pcVar3;
  memcpy(pcVar3,other->pc,__n_02);
  __dest = (uchar *)operator_new__(__n_02);
  this->puc = __dest;
  memcpy(__dest,other->puc,__n_02);
  __dest_00 = (short *)operator_new__(uVar10);
  this->ps = __dest_00;
  memcpy(__dest_00,other->ps,__n_01);
  __dest_01 = (unsigned_short *)operator_new__(uVar10);
  this->pus = __dest_01;
  memcpy(__dest_01,other->pus,__n_01);
  __dest_02 = (int *)operator_new__(sVar7);
  this->pi = __dest_02;
  memcpy(__dest_02,other->pi,__n_00);
  __dest_03 = (uint *)operator_new__(sVar7);
  this->pui = __dest_03;
  memcpy(__dest_03,other->pui,__n_00);
  __dest_04 = (long *)operator_new__(sVar6);
  this->pl = __dest_04;
  memcpy(__dest_04,other->pl,__n);
  __dest_05 = (unsigned_long *)operator_new__(sVar6);
  this->pul = __dest_05;
  memcpy(__dest_05,other->pul,__n);
  __dest_06 = (longlong *)operator_new__(sVar6);
  this->pll = __dest_06;
  memcpy(__dest_06,other->pll,__n);
  __dest_07 = (unsigned_long_long *)operator_new__(sVar6);
  this->pull = __dest_07;
  memcpy(__dest_07,other->pull,__n);
  __dest_08 = (float *)operator_new__(sVar7);
  this->pf = __dest_08;
  memcpy(__dest_08,other->pf,__n_00);
  __dest_09 = (double *)operator_new__(sVar6);
  this->pd = __dest_09;
  memcpy(__dest_09,other->pd,__n);
  __dest_10 = (longdouble *)operator_new__(sVar5);
  this->pld = __dest_10;
  memcpy(__dest_10,other->pld,__n_02 << 4);
  puVar8 = (ulong *)operator_new__(uVar4);
  *puVar8 = __n_02;
  if (__n_02 != 0) {
    puVar9 = puVar8 + 3;
    do {
      puVar9[-2] = (ulong)puVar9;
      puVar9[-1] = 0;
      *(undefined1 *)puVar9 = 0;
      puVar9 = puVar9 + 4;
      lVar11 = lVar11 + -0x20;
    } while (lVar11 != 0);
  }
  this->pto = (TestArrObj *)(puVar8 + 1);
  if (this->SIZE != 0) {
    lVar11 = 0;
    uVar10 = 0;
    do {
      std::__cxx11::string::_M_assign((string *)((long)&(this->pto->str)._M_dataplus._M_p + lVar11))
      ;
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 0x20;
    } while (uVar10 < (ulong)(long)this->SIZE);
  }
  std::shared_ptr<int>::operator=(&this->spi,&other->spi);
  std::shared_ptr<TestArrObj>::operator=(&this->spto,&other->spto);
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

PrimitiveTestClass &operator=(const PrimitiveTestClass &other)
        {
            c = other.c;
            uc = other.uc;
            s = other.s;
            us = other.us;
            i = other.i;
            ui = other.ui;
            l = other.l;
            ul = other.ul;
            ll = other.ll;
            ull = other.ull;
            f = other.f;
            d = other.d;
            ld = other.ld;

            str = new char[strlen("Hello World!") + 1];
            memcpy(str, other.str, strlen("Hello World!") + 1);

            pc = new char[SIZE];
            memcpy(pc, other.pc, SIZE);
            puc = new unsigned char[SIZE];
            memcpy(puc, other.puc, SIZE);
            ps = new short[SIZE];
            memcpy(ps, other.ps, SIZE * sizeof(short));
            pus = new unsigned short[SIZE];
            memcpy(pus, other.pus, SIZE * sizeof(unsigned short));
            pi = new int[SIZE];
            memcpy(pi, other.pi, SIZE * sizeof(int));
            pui = new unsigned int[SIZE];
            memcpy(pui, other.pui, SIZE * sizeof(unsigned int));
            pl = new long[SIZE];
            memcpy(pl, other.pl, SIZE * sizeof(long));
            pul = new unsigned long[SIZE];
            memcpy(pul, other.pul, SIZE * sizeof(unsigned long));
            pll = new long long[SIZE];
            memcpy(pll, other.pll, SIZE * sizeof(long long));
            pull = new unsigned long long[SIZE];
            memcpy(pull, other.pull, SIZE * sizeof(unsigned long long));
            pf = new float[SIZE];
            memcpy(pf, other.pf, SIZE * sizeof(float));
            pd = new double[SIZE];
            memcpy(pd, other.pd, SIZE * sizeof(double));
            pld = new long double[SIZE];
            memcpy(pld, other.pld, SIZE * sizeof(long double));

            pto = new TestArrObj[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                pto[i] = other.pto[i];
            }

            spi = other.spi;
            spto = other.spto;
        }